

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O0

int next_null(hd_context *ctx,hd_stream *stm,size_t max)

{
  long *plVar1;
  byte *pbVar2;
  size_t local_38;
  size_t n;
  null_filter *state;
  size_t max_local;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  plVar1 = (long *)stm->state;
  if (plVar1[1] == 0) {
    ctx_local._4_4_ = 0xffffffff;
  }
  else {
    hd_seek(ctx,(hd_stream *)*plVar1,plVar1[2],0);
    local_38 = hd_available(ctx,(hd_stream *)*plVar1,max);
    if ((ulong)plVar1[1] < local_38) {
      local_38 = plVar1[1];
    }
    if (0x1000 < local_38) {
      local_38 = 0x1000;
    }
    memcpy(plVar1 + 3,*(void **)(*plVar1 + 0x18),local_38);
    stm->rp = (uchar *)(plVar1 + 3);
    stm->wp = stm->rp + local_38;
    if (local_38 == 0) {
      ctx_local._4_4_ = 0xffffffff;
    }
    else {
      *(size_t *)(*plVar1 + 0x18) = local_38 + *(long *)(*plVar1 + 0x18);
      plVar1[1] = plVar1[1] - local_38;
      plVar1[2] = (long)(int)local_38 + plVar1[2];
      stm->pos = (int)local_38 + stm->pos;
      pbVar2 = stm->rp;
      stm->rp = pbVar2 + 1;
      ctx_local._4_4_ = (uint)*pbVar2;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int
next_null(hd_context *ctx, hd_stream *stm, size_t max)
{
    struct null_filter *state = stm->state;
    size_t n;

    if (state->remain == 0)
        return EOF;
    hd_seek(ctx, state->chain, state->offset, 0);
    n = hd_available(ctx, state->chain, max);
    if (n > state->remain)
        n = state->remain;
    if (n > sizeof(state->buffer))
        n = sizeof(state->buffer);
    memcpy(state->buffer, state->chain->rp, n);
    stm->rp = state->buffer;
    stm->wp = stm->rp + n;
    if (n == 0)
        return EOF;
    state->chain->rp += n;
    state->remain -= n;
    state->offset += (hd_off_t)n;
    stm->pos += (hd_off_t)n;
    return *stm->rp++;
}